

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O3

CommandInfo * findCommandByName(String *fname)

{
  CommandInfo *this;
  _Elt_pointer ppCVar1;
  _Alloc_hider _Var2;
  int iVar3;
  _Elt_pointer ppCVar4;
  _Elt_pointer ppCVar5;
  _Map_pointer pppCVar6;
  bool bVar7;
  String local_70;
  String local_50;
  
  ppCVar1 = Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl
            .super__Deque_impl_data._M_finish._M_cur;
  ppCVar4 = Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl
            .super__Deque_impl_data._M_start._M_last;
  ppCVar5 = Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl
            .super__Deque_impl_data._M_start._M_cur;
  pppCVar6 = Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node;
  if (Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur !=
      Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur) {
    do {
      this = *ppCVar5;
      String::toUppercase(&local_70,fname);
      String::toUppercase(&local_50,&this->name);
      _Var2._M_p = local_50._string._M_dataplus._M_p;
      if (local_70._string._M_string_length == local_50._string._M_string_length) {
        if (local_70._string._M_string_length == 0) {
          bVar7 = true;
        }
        else {
          iVar3 = bcmp(local_70._string._M_dataplus._M_p,local_50._string._M_dataplus._M_p,
                       local_70._string._M_string_length);
          bVar7 = iVar3 == 0;
        }
      }
      else {
        bVar7 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var2._M_p != &local_50._string.field_2) {
        operator_delete(_Var2._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._string._M_dataplus._M_p != &local_70._string.field_2) {
        operator_delete(local_70._string._M_dataplus._M_p);
      }
      if (bVar7) {
        return this;
      }
      ppCVar5 = ppCVar5 + 1;
      if (ppCVar5 == ppCVar4) {
        ppCVar5 = pppCVar6[1];
        pppCVar6 = pppCVar6 + 1;
        ppCVar4 = ppCVar5 + 0x40;
      }
    } while (ppCVar5 != ppCVar1);
  }
  return (CommandInfo *)0x0;
}

Assistant:

CommandInfo* findCommandByName (String fname)
{
	for (CommandInfo* comm : Commands)
	{
		if (fname.toUppercase() == comm->name.toUppercase())
			return comm;
	}

	return null;
}